

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O0

void __thiscall HighsIis::removeCol(HighsIis *this,HighsInt col)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  int in_ESI;
  size_type in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  HighsInt num_col;
  size_type __new_size;
  
  __new_size = in_RDI;
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 8));
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)((int)sVar2 + -1));
  vVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)in_ESI);
  *pvVar3 = vVar1;
  std::vector<int,_std::allocator<int>_>::resize(unaff_retaddr,__new_size);
  return;
}

Assistant:

void HighsIis::removeCol(const HighsInt col) {
  HighsInt num_col = this->col_index_.size();
  assert(col < num_col);
  this->col_index_[col] = this->col_index_[num_col - 1];
  this->col_index_.resize(num_col - 1);
}